

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Samba.cpp
# Opt level: O1

void __thiscall Samba::chipErase(Samba *this,uint32_t start_addr)

{
  SerialPort *pSVar1;
  uint uVar2;
  uint uVar3;
  undefined8 *puVar4;
  uint8_t cmd [64];
  char local_58 [64];
  
  if (this->_canChipErase != false) {
    if (this->_debug == true) {
      printf("%s(addr=%#x)\n","chipErase",start_addr);
    }
    uVar2 = snprintf(local_58,0x40,"X%08X#",start_addr);
    pSVar1 = (this->_port)._M_t.super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>.
             _M_t.super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
             super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
    uVar3 = (*pSVar1->_vptr_SerialPort[6])(pSVar1,local_58,(ulong)uVar2);
    if (uVar3 == uVar2) {
      pSVar1 = (this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
      (*pSVar1->_vptr_SerialPort[9])(pSVar1,5000);
      pSVar1 = (this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
      (*pSVar1->_vptr_SerialPort[5])(pSVar1,local_58,3);
      pSVar1 = (this->_port)._M_t.
               super___uniq_ptr_impl<SerialPort,_std::default_delete<SerialPort>_>._M_t.
               super__Tuple_impl<0UL,_SerialPort_*,_std::default_delete<SerialPort>_>.
               super__Head_base<0UL,_SerialPort_*,_false>._M_head_impl;
      (*pSVar1->_vptr_SerialPort[9])(pSVar1,1000);
      if (local_58[0] == 'X') {
        return;
      }
    }
  }
  puVar4 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar4 = &PTR__exception_001195a0;
  __cxa_throw(puVar4,&SambaError::typeinfo,std::exception::~exception);
}

Assistant:

void
Samba::chipErase(uint32_t start_addr)
{
    if (!_canChipErase)
        throw SambaError();

    uint8_t cmd[64];

    if (_debug)
        printf("%s(addr=%#x)\n", __FUNCTION__, start_addr);

    int l = snprintf((char*) cmd, sizeof(cmd), "X%08X#", start_addr);
    if (_port->write(cmd, l) != l)
        throw SambaError();
    _port->timeout(TIMEOUT_LONG);
    _port->read(cmd, 3); // Expects "X\n\r"
    _port->timeout(TIMEOUT_NORMAL);
    if (cmd[0] != 'X')
        throw SambaError();
}